

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O1

void __thiscall MinVR::VRDataIndex::VRDataIndex(VRDataIndex *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  
  p_Var1 = &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_lastDatum)._M_node = (_Base_ptr)0x0;
  (this->_indexName)._M_dataplus._M_p = (pointer)&(this->_indexName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_indexName,"MVR","");
  this->_overwrite = 1;
  p_Var2 = &(this->_linkRegister)._M_t._M_impl.super__Rb_tree_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_linkRegister)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_linkNeeded = false;
  (this->_lastDatum)._M_node = &p_Var1->_M_header;
  return;
}

Assistant:

VRDataIndex()  : _indexName("MVR"), _overwrite(1), _linkNeeded(false) {
    _lastDatum = _theIndex.end();
  }